

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O2

wchar_t scan_unicode_pattern
                  (char *out,wchar_t *wout,char *u16be,char *u16le,char *pattern,wchar_t mac_nfd)

{
  wchar_t wVar1;
  ushort *puVar2;
  byte bVar3;
  wchar_t wVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  char *_p;
  uint *puVar9;
  byte bVar10;
  int iVar11;
  wchar_t wVar12;
  
  uVar5 = 0;
  wVar1 = L'\0';
  puVar9 = (uint *)out;
  do {
    bVar6 = *pattern;
    wVar4 = (wchar_t)uVar5;
    puVar2 = (ushort *)u16be;
    if ((byte)(bVar6 - 0x30) < 10) {
      uVar5 = (ulong)(uint)((uint)(byte)(bVar6 - 0x30) | wVar4 << 4);
    }
    else if ((byte)(bVar6 + 0xbf) < 6) {
      uVar5 = (ulong)(uint)((wVar4 * 0x10 + (uint)bVar6) - 0x37);
    }
    else {
      if (((mac_nfd != L'\0') && (puVar9 == (uint *)out)) &&
         ((((((uint)(wVar4 + L'\xffffddbc') < 0x3e &&
             ((0x30f73e0050000029U >> ((ulong)(uint)(wVar4 + L'\xffffddbc') & 0x3f) & 1) != 0)) ||
            (((uint)(wVar4 + L'\xffffdd7c') < 0x2c &&
             ((0xf0000000033U >> ((ulong)(uint)(wVar4 + L'\xffffdd7c') & 0x3f) & 1) != 0)))) ||
           (((uint)(wVar4 + L'\xffffdd20') < 0xe &&
            ((0x3c0fU >> (wVar4 + L'\xffffdd20' & 0x1fU) & 1) != 0)))) ||
          (((((uint)(wVar4 + L'\xffffde6c') < 0x3c &&
             ((0xe000000040000c1U >> ((ulong)(uint)(wVar4 + L'\xffffde6c') & 0x3f) & 1) != 0)) ||
            (((uint)(wVar4 + L'\xffffddfc') < 0x3e &&
             ((0x2000000500000121U >> ((ulong)(uint)(wVar4 + L'\xffffddfc') & 0x3f) & 1) != 0)))) ||
           (((uint)(wVar4 + L'\xfffeef66') < 0x12 &&
            ((0x20005U >> (wVar4 + L'\xfffeef66' & 0x1fU) & 1) != 0)))))))) {
        wVar1 = L'\x01';
      }
      bVar3 = (byte)uVar5;
      bVar6 = (byte)(uVar5 >> 8);
      if ((uint)wVar4 < 0x10000) {
        puVar2 = (ushort *)((long)u16be + 2);
        *(ushort *)u16be = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
        lVar7 = 2;
        wVar12 = wVar4;
      }
      else {
        wVar12 = (uint)(wVar4 + L'\x000f0000') >> 10;
        bVar10 = (byte)((uint)(wVar4 + L'\x000f0000') >> 0x12) & 3 | 0xd8;
        bVar6 = bVar6 & 3 | 0xdc;
        *(byte *)((long)u16be + 2) = bVar6;
        *(byte *)((long)u16be + 3) = bVar3;
        *u16be = bVar10;
        *(char *)((long)u16be + 1) = (char)wVar12;
        puVar2 = (ushort *)((long)u16be + 4);
        u16le[2] = bVar3;
        u16le[3] = bVar6;
        lVar7 = 4;
        bVar6 = bVar10;
      }
      *u16le = (char)wVar12;
      u16le[1] = bVar6;
      *wout = wVar4;
      iVar8 = (int)puVar9;
      if ((uint)wVar4 < 0x80) {
        iVar11 = iVar8 + 1;
        *(byte *)puVar9 = bVar3;
      }
      else if ((uint)wVar4 < 0x800) {
        *(byte *)puVar9 = (byte)(uVar5 >> 6) | 0xc0;
        iVar11 = iVar8 + 2;
        *(byte *)((long)puVar9 + 1) = bVar3 & 0x3f | 0x80;
      }
      else if ((uint)wVar4 < 0x10000) {
        *(byte *)puVar9 = (byte)((uint)wVar4 >> 0xc) | 0xe0;
        *(byte *)((long)puVar9 + 1) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        iVar11 = iVar8 + 3;
        *(byte *)((long)puVar9 + 2) = bVar3 & 0x3f | 0x80;
      }
      else {
        iVar11 = iVar8 + 4;
        *puVar9 = (wVar4 << 0x18 |
                  (wVar4 & 0x3fc0U) << 10 | (uint)wVar4 >> 0x12 & 0xff | (uint)(uVar5 >> 4) & 0xff00
                  ) & 0x3f3f3f07U | 0x808080f0;
      }
      u16le = u16le + lVar7;
      wout = wout + 1;
      puVar9 = (uint *)((long)puVar9 + (long)(iVar11 - iVar8));
      uVar5 = 0;
      if (*pattern == 0) {
        *(char *)((long)u16be + lVar7) = '\0';
        *(char *)((long)puVar2 + 1) = '\0';
        u16le[0] = '\0';
        u16le[1] = '\0';
        *wout = L'\0';
        *(byte *)puVar9 = 0;
        return wVar1;
      }
    }
    pattern = (char *)((byte *)pattern + 1);
    u16be = (char *)puVar2;
  } while( true );
}

Assistant:

static int
scan_unicode_pattern(char *out, wchar_t *wout, char *u16be, char *u16le,
    const char *pattern, int mac_nfd)
{
	unsigned uc = 0;
	const char *p = pattern;
	char *op = out;
	wchar_t *owp = wout;
	char *op16be = u16be;
	char *op16le = u16le;
	int ret = 0;

	for (;;) {
		if (*p >= '0' && *p <= '9')
			uc = (uc << 4) + (*p - '0');
		else if (*p >= 'A' && *p <= 'F')
			uc = (uc << 4) + (*p - 'A' + 0x0a);
		else {
			if (mac_nfd && op == out) {
				/*
				 * These are not converted to NFD on Mac OS.
 				 * U+2000 - U+2FFF
				 * U+F900 - U+FAFF
				 * U+2F800 - U+2FAFF
				 */
				switch (uc) {
				case 0x2194: case 0x219A: case 0x219B:
				case 0x21AE: case 0x21CD: case 0x21CE:
				case 0x21CF: case 0x2204: case 0x2209:
				case 0x220C: case 0x2224: case 0x2226:
				case 0x2241: case 0x2244: case 0x2247:
				case 0x2249: case 0x2260: case 0x2262:
				case 0x226D: case 0x226E: case 0x226F:
				case 0x2270: case 0x2271: case 0x2274:
				case 0x2275: case 0x2276: case 0x2278:
				case 0x2279: case 0x227A: case 0x227B:
				case 0x2280: case 0x2281: case 0x2284:
				case 0x2285: case 0x2288: case 0x2289:
				case 0x22AC: case 0x22AD: case 0x22AE:
				case 0x22AF: case 0x22E0: case 0x22E1:
				case 0x22E2: case 0x22E3: case 0x22EA:
				case 0x22EB: case 0x22EC: case 0x22ED:
				
				/*
				 * Those code points are not converted to
				 * NFD on Mac OS. I do not know the reason
				 * because it is undocumented.
				 *   NFC        NFD
				 *   1109A  ==> 11099 110BA
				 *   1109C  ==> 1109B 110BA
				 *   110AB  ==> 110A5 110BA
				 */
				case 0x1109A: case 0x1109C: case 0x110AB:
					ret = 1;
					break;
				}
			}
			op16be += unicode_to_utf16be(op16be, uc);
			op16le += unicode_to_utf16le(op16le, uc);
			owp += unicode_to_wc(owp, uc);
			op += unicode_to_utf8(op, uc);
			if (!*p) {
				*op16be++ = 0;
				*op16be = 0;
				*op16le++ = 0;
				*op16le = 0;
				*owp = L'\0';
				*op = '\0';
				break;
			}
			uc = 0;
		}
		p++;
	}
	return (ret);
}